

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp:494:58)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_date_object_cpp:494:58)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  long *plVar1;
  undefined8 *puVar2;
  double dVar3;
  object_ptr o;
  value to_iso;
  undefined1 local_88 [16];
  pointer local_78;
  undefined1 local_68 [40];
  value tv;
  
  plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  (**(code **)(*plVar1 + 0x88))(&o,plVar1,this_);
  value::value(&to_iso,&o);
  to_primitive(&tv,&to_iso,number);
  value::~value(&to_iso);
  if (tv.type_ == number) {
    dVar3 = value::number_value(&tv);
    if (0x7fefffffffffffff < (ulong)ABS(dVar3)) {
      value::value(__return_storage_ptr__,(value *)value::null);
      goto LAB_0016ca30;
    }
  }
  puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
  local_68._0_8_ = 0xb;
  local_68._8_8_ = L"toISOString";
  (**(code **)*puVar2)(&to_iso,puVar2);
  value::value((value *)local_68,&o);
  local_88 = (undefined1  [16])0x0;
  local_78 = (pointer)0x0;
  call_function(__return_storage_ptr__,&to_iso,(value *)local_68,
                (vector<mjs::value,_std::allocator<mjs::value>_> *)local_88);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
            ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_88);
  value::~value((value *)local_68);
  value::~value(&to_iso);
LAB_0016ca30:
  value::~value(&tv);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }